

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printAssociativeContainer<QMultiMap<QSsl::AlternativeNameEntryType,QString>>
                 (QDebug *debug,char *which,QMultiMap<QSsl::AlternativeNameEntryType,_QString> *c)

{
  bool bVar1;
  QDebug *o;
  undefined8 in_RCX;
  QDebug *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff8f;
  const_iterator *in_stack_ffffffffffffff90;
  Stream *this;
  QDebug local_30;
  QDebug in_stack_ffffffffffffffd8;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_RSI,(char *)in_stack_ffffffffffffffd8.stream);
  QDebug::operator<<(in_RSI,(char *)in_stack_ffffffffffffffd8.stream);
  QMultiMap<QSsl::AlternativeNameEntryType,_QString>::constBegin
            ((QMultiMap<QSsl::AlternativeNameEntryType,_QString> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  while( true ) {
    QMultiMap<QSsl::AlternativeNameEntryType,_QString>::constEnd
              ((QMultiMap<QSsl::AlternativeNameEntryType,_QString> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    bVar1 = ::operator!=(in_stack_ffffffffffffff90,
                         (const_iterator *)
                         CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    if (!bVar1) break;
    o = QDebug::operator<<((QDebug *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
    QDebug::QDebug(&local_30,o);
    QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator::key
              ((const_iterator *)0x2758c0);
    ::operator<<(in_RDX,(AlternativeNameEntryType)((ulong)in_RCX >> 0x20));
    in_stack_ffffffffffffff90 =
         (const_iterator *)QDebug::operator<<(in_RSI,(char *)in_stack_ffffffffffffffd8.stream);
    QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator::value
              ((const_iterator *)0x2758f1);
    QDebug::operator<<((QDebug *)this,(QString *)in_RDI);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffd8);
    QDebug::~QDebug(&local_30);
    QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator::operator++
              (in_stack_ffffffffffffff90);
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  QDebug::QDebug((QDebug *)in_stack_ffffffffffffff90,
                 (QDebug *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}